

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::ClearOneof
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  uint32 uVar1;
  FieldDescriptor *this_00;
  Arena *pAVar2;
  ArenaStringPtr *this_01;
  string *default_value;
  Message **ppMVar3;
  uint32 *puVar4;
  string *default_ptr;
  FieldDescriptor *field;
  uint32 oneof_case;
  FieldDescriptor *in_stack_ffffffffffffffa8;
  Arena *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  CppType in_stack_ffffffffffffffc4;
  
  uVar1 = GetOneofCase((Reflection *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (Message *)in_stack_ffffffffffffffb8,
                       (OneofDescriptor *)in_stack_ffffffffffffffb0);
  if (uVar1 != 0) {
    this_00 = Descriptor::FindFieldByNumber
                        ((Descriptor *)in_stack_ffffffffffffffb8,
                         (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    pAVar2 = GetArena((Reflection *)in_stack_ffffffffffffffb0,(Message *)in_stack_ffffffffffffffa8);
    if (pAVar2 == (Arena *)0x0) {
      in_stack_ffffffffffffffc4 = FieldDescriptor::cpp_type((FieldDescriptor *)0x425834);
      if (in_stack_ffffffffffffffc4 == CPPTYPE_STRING) {
        FieldDescriptor::options(this_00);
        FieldOptions::ctype((FieldOptions *)0x425865);
        this_01 = DefaultRaw<google::protobuf::internal::ArenaStringPtr>
                            ((Reflection *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        default_value = internal::ArenaStringPtr::Get_abi_cxx11_(this_01);
        in_stack_ffffffffffffffb0 =
             (Arena *)MutableField<google::protobuf::internal::ArenaStringPtr>
                                ((Reflection *)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 (Message *)in_stack_ffffffffffffffb8,
                                 (FieldDescriptor *)in_stack_ffffffffffffffb0);
        GetArena((Reflection *)in_stack_ffffffffffffffb0,(Message *)in_stack_ffffffffffffffa8);
        internal::ArenaStringPtr::Destroy
                  ((ArenaStringPtr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   default_value,in_stack_ffffffffffffffb0);
        in_stack_ffffffffffffffb8 = default_value;
      }
      else if (in_stack_ffffffffffffffc4 == CPPTYPE_MESSAGE) {
        ppMVar3 = MutableRaw<google::protobuf::Message*>
                            ((Reflection *)CONCAT44(10,in_stack_ffffffffffffffc0),
                             (Message *)in_stack_ffffffffffffffb8,
                             (FieldDescriptor *)in_stack_ffffffffffffffb0);
        if (*ppMVar3 != (Message *)0x0) {
          (*((*ppMVar3)->super_MessageLite)._vptr_MessageLite[1])();
        }
      }
    }
    puVar4 = MutableOneofCase((Reflection *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              (Message *)in_stack_ffffffffffffffb8,
                              (OneofDescriptor *)in_stack_ffffffffffffffb0);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void Reflection::ClearOneof(Message* message,
                            const OneofDescriptor* oneof_descriptor) const {
  // TODO(jieluo): Consider to cache the unused object instead of deleting
  // it. It will be much faster if an application switches a lot from
  // a few oneof fields.  Time/space tradeoff
  uint32 oneof_case = GetOneofCase(*message, oneof_descriptor);
  if (oneof_case > 0) {
    const FieldDescriptor* field = descriptor_->FindFieldByNumber(oneof_case);
    if (GetArena(message) == nullptr) {
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableField<ArenaStringPtr>(message, field)
                  ->Destroy(default_ptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          delete *MutableRaw<Message*>(message, field);
          break;
        default:
          break;
      }
    }

    *MutableOneofCase(message, oneof_descriptor) = 0;
  }
}